

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

object * gcollect(int sz)

{
  object *poVar1;
  
  do_gc();
  memoryPointer = (object *)((long)&memoryPointer->header + (long)(sz * -8 + -0x10));
  poVar1 = memoryPointer;
  if ((long)memoryPointer < (long)memoryBase) {
    error_impl("gcollect",0x14a,
               "insufficient memory after garbage collection when allocating object of size %d!",sz)
    ;
    poVar1 = memoryPointer;
  }
  memoryPointer = poVar1;
  poVar1->header = (ulong)(uint)(sz << 2);
  return poVar1;
}

Assistant:

struct object *gcollect(int sz)
{
    /* force a GC */
    do_gc();

    /* then see if there is room for allocation */
    memoryPointer = WORDSDOWN(memoryPointer, sz + 2);
    if ((intptr_t)memoryPointer < (intptr_t)memoryBase) {
        error("insufficient memory after garbage collection when allocating object of size %d!", sz);
    }
    SET_SIZE(memoryPointer, sz);

    return(memoryPointer);
}